

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queens-seq.c
# Opt level: O2

int main(int argc,char **argv)

{
  long lVar1;
  uint n;
  long lVar2;
  double dVar3;
  undefined8 uStack_30;
  double local_28;
  double local_20;
  
  if (argc != 1) {
    uStack_30 = 0x101309;
    n = atoi(argv[1]);
    lVar1 = -((long)(int)n + 0xfU & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10132d;
    printf("running queens %d sequentially...\n");
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x101332;
    local_28 = wctime();
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x101343;
    lVar2 = nqueens(n,0,(char *)((long)&local_28 + lVar1));
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10134b;
    local_20 = wctime();
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x101363;
    printf("Result: Q(%d) = %ld\n",(ulong)n,lVar2);
    dVar3 = local_20 - local_28;
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10137b;
    printf("Time: %f\n",dVar3);
    return 0;
  }
  uStack_30 = 0x10138e;
  usage(*argv);
  uStack_30 = 0x101396;
  exit(1);
}

Assistant:

int main(int argc, char *argv[])
{
    if (1 == argc) {
        usage(argv[0]);
        exit(1);
    }

    int n = atoi(argv[1]);

    char *a = (char*)alloca(n*sizeof(char));

    printf("running queens %d sequentially...\n", n);

    double t1 = wctime();
    long res = nqueens(n, 0, a);
    double t2 = wctime();

    printf("Result: Q(%d) = %ld\n", n, res);

    printf("Time: %f\n", t2-t1);

    return 0;
}